

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_ectg(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int b2;
  TCGv_i64 retval;
  TCGv_i64 pTVar5;
  TCGv_i64 addr;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_b1,FLD_C_b1);
  iVar2 = get_field1(s,FLD_O_d1,FLD_C_d1);
  iVar3 = get_field1(s,FLD_O_b2,FLD_C_b2);
  iVar4 = get_field1(s,FLD_O_d2,FLD_C_d2);
  b2 = get_field1(s,FLD_O_r3,FLD_C_i3);
  retval = tcg_temp_new_i64(tcg_ctx);
  pTVar5 = tcg_temp_new_i64(tcg_ctx);
  o->in1 = pTVar5;
  tcg_gen_addi_i64_s390x(tcg_ctx,pTVar5,tcg_ctx->regs[iVar1],(long)iVar2);
  pTVar5 = tcg_temp_new_i64(tcg_ctx);
  o->in2 = pTVar5;
  tcg_gen_addi_i64_s390x(tcg_ctx,pTVar5,tcg_ctx->regs[iVar3],(long)iVar4);
  addr = get_address(s,0,b2,0);
  o->addr1 = addr;
  pTVar5 = tcg_ctx->regs[b2];
  iVar1 = get_mem_index(s);
  tcg_gen_qemu_ld64(tcg_ctx,pTVar5,addr,iVar1);
  gen_helper_stpt(tcg_ctx,retval,tcg_ctx->cpu_env);
  tcg_gen_sub_i64(tcg_ctx,tcg_ctx->regs[0],o->in1,retval);
  tcg_gen_mov_i64_s390x(tcg_ctx,tcg_ctx->regs[1],o->in2);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(retval + (long)tcg_ctx));
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_ectg(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int b1 = get_field(s, b1);
    int d1 = get_field(s, d1);
    int b2 = get_field(s, b2);
    int d2 = get_field(s, d2);
    int r3 = get_field(s, r3);
    TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);

    /* fetch all operands first */
    o->in1 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_addi_i64(tcg_ctx, o->in1, tcg_ctx->regs[b1], d1);
    o->in2 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_addi_i64(tcg_ctx, o->in2, tcg_ctx->regs[b2], d2);
    o->addr1 = get_address(s, 0, r3, 0);

    /* load the third operand into r3 before modifying anything */
    tcg_gen_qemu_ld64(tcg_ctx, tcg_ctx->regs[r3], o->addr1, get_mem_index(s));

    /* subtract CPU timer from first operand and store in GR0 */
    gen_helper_stpt(tcg_ctx, tmp, tcg_ctx->cpu_env);
    tcg_gen_sub_i64(tcg_ctx, tcg_ctx->regs[0], o->in1, tmp);

    /* store second operand in GR1 */
    tcg_gen_mov_i64(tcg_ctx, tcg_ctx->regs[1], o->in2);

    tcg_temp_free_i64(tcg_ctx, tmp);
    return DISAS_NEXT;
}